

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

Status cmSystemTools::MakeTempDirectory(char *path,mode_t *mode)

{
  int iVar1;
  char *pcVar2;
  Status SVar3;
  __mode_t __mode;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  SVar3.Kind_ = POSIX;
  SVar3.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x16;
  if (((path != (char *)0x0) && (local_28._M_len = strlen(path), 5 < local_28._M_len)) &&
     (__str._M_str = "XXXXXX", __str._M_len = 6, local_28._M_str = path,
     iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                       (&local_28,local_28._M_len - 6,6,__str), iVar1 == 0)) {
    for (pcVar2 = strchr(path,0x2f); pcVar2 != (char *)0x0; pcVar2 = strchr(pcVar2 + 1,0x2f)) {
      *pcVar2 = '\0';
      if (mode == (mode_t *)0x0) {
        __mode = 0x1ff;
      }
      else {
        __mode = *mode;
      }
      mkdir(path,__mode);
      *pcVar2 = '/';
    }
    pcVar2 = mkdtemp(path);
    if (pcVar2 == (char *)0x0) {
      SVar3 = cmsys::Status::POSIX_errno();
    }
    else {
      if (mode != (mode_t *)0x0) {
        chmod(path,*mode);
      }
      SVar3.Kind_ = Success;
      SVar3.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
    }
  }
  return SVar3;
}

Assistant:

cmsys::Status cmSystemTools::MakeTempDirectory(char* path, const mode_t* mode)
{
  if (!path) {
    return cmsys::Status::POSIX(EINVAL);
  }

  // verify that path ends with "XXXXXX"
  const auto l = std::strlen(path);
  if (!cmHasLiteralSuffix(cm::string_view{ path, l }, "XXXXXX")) {
    return cmsys::Status::POSIX(EINVAL);
  }

  // create parent directories
  auto* sep = path;
  while ((sep = strchr(sep, '/'))) {
    // all underlying functions use C strings,
    // so temporarily end the string here
    *sep = '\0';
    Mkdir(path, mode);

    *sep = '/';
    ++sep;
  }

#ifdef _WIN32
  const int nchars = 36;
  const char chars[nchars + 1] = "abcdefghijklmnopqrstuvwxyz0123456789";

  std::random_device rd;
  std::mt19937 rg{ rd() };
  std::uniform_int_distribution<int> dist{ 0, nchars - 1 };

  for (auto tries = 100; tries; --tries) {
    for (auto n = l - 6; n < l; ++n) {
      path[n] = chars[dist(rg)];
    }
    if (Mkdir(path, mode) == 0) {
      return cmsys::Status::Success();
    } else if (errno != EEXIST) {
      return cmsys::Status::POSIX_errno();
    }
  }
  return cmsys::Status::POSIX(EAGAIN);
#else
  if (mkdtemp(path)) {
    if (mode) {
      chmod(path, *mode);
    }
  } else {
    return cmsys::Status::POSIX_errno();
  }
  return cmsys::Status::Success();
#endif
}